

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtAudio.cpp
# Opt level: O1

RtAudioErrorType __thiscall RtApi::error(RtApi *this,RtAudioErrorType type)

{
  ostream *poVar1;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"");
  std::__cxx11::stringbuf::str((string *)&this->field_0x10);
  if (local_40[0] != local_30) {
    operator_delete(local_40[0]);
  }
  if ((type != RTAUDIO_WARNING) || (this->showWarnings_ != false)) {
    if ((this->errorCallback_).super__Function_base._M_manager == (_Manager_type)0x0) {
      local_40[0] = (undefined1 *)CONCAT71(local_40[0]._1_7_,10);
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(char *)local_40,1);
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar1,(this->errorText_)._M_dataplus._M_p,
                          (this->errorText_)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\n",2);
    }
    else {
      local_40[0] = (undefined1 *)CONCAT44(local_40[0]._4_4_,type);
      (*(this->errorCallback_)._M_invoker)
                ((_Any_data *)&this->errorCallback_,(RtAudioErrorType *)local_40,&this->errorText_);
    }
  }
  return type;
}

Assistant:

RtAudioErrorType RtApi :: error( RtAudioErrorType type )
{
  errorStream_.str(""); // clear the ostringstream to avoid repeated messages

  // Don't output warnings if showWarnings_ is false
  if ( type == RTAUDIO_WARNING && showWarnings_ == false ) return type;
  
  if ( errorCallback_ ) {
    //const std::string errorMessage = errorText_;
    //errorCallback_( type, errorMessage );
    errorCallback_( type, errorText_ );
  }
  else
    std::cerr << '\n' << errorText_ << "\n\n";
  return type;
}